

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  Dispatch_Engine *this;
  _Alloc_hider _Var2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  undefined4 extraout_var;
  pointer pcVar6;
  ostream *poVar7;
  size_t __len2;
  istream *piVar8;
  undefined8 uVar9;
  size_type sVar10;
  int iVar11;
  element_type *peVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  initializer_list<chaiscript::Options> __l;
  string arg;
  string line;
  __string_type __str;
  char *modulepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulepaths;
  char *usepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usepaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchpaths;
  ChaiScript_Basic chai;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  ModulePtr local_478;
  undefined1 local_468 [40];
  pointer local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  pointer local_418;
  _Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false> local_410;
  pointer local_408;
  pointer local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8;
  char *local_3e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  undefined1 local_370 [32];
  ChaiScript_Basic local_350;
  
  local_408 = (pointer)argv;
  pcVar5 = getenv("CHAI_USE_PATH");
  local_3e0 = pcVar5;
  local_400 = (pointer)getenv("CHAI_MODULE_PATH");
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3d8,
             (char (*) [1])0x364f0b);
  if (pcVar5 != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3d8,
               &local_3e0);
  }
  local_3f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  default_search_paths_abi_cxx11_();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
             local_3f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             local_3b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_3b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
             (char (*) [1])0x364f0b);
  if (local_400 != (pointer)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3f8,
               (char **)&local_400);
  }
  create_chaiscript_stdlib();
  create_chaiscript_parser();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_388,&local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a0,&local_3d8);
  local_438._M_dataplus._M_p = (pointer)0x300000001;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_438;
  std::vector<chaiscript::Options,_std::allocator<chaiscript::Options>_>::vector
            ((vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_498,__l,
             (allocator_type *)(local_468 + 0x27));
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (&local_350,&local_478,
             (unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
              *)&local_410,&local_388,&local_3a0,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&local_498);
  if (local_498._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_498._M_dataplus._M_p,
                    local_498.field_2._M_allocated_capacity - (long)local_498._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_388);
  if (local_410._M_head_impl != (ChaiScript_Parser_Base *)0x0) {
    (*(local_410._M_head_impl)->_vptr_ChaiScript_Parser_Base[4])();
  }
  if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_438._M_dataplus._M_p = (pointer)myexit;
  chaiscript::dispatch::detail::make_callable_impl<void(*)(int),false,false,false,false,void,int>
            (&local_478);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"exit","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_498);
  this = &local_350.m_engine;
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_478,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_438._M_dataplus._M_p = (pointer)myexit;
  chaiscript::dispatch::detail::make_callable_impl<void(*)(int),false,false,false,false,void,int>
            (&local_478);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"quit","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_498);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_478,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_438._M_dataplus._M_p = (pointer)help;
  chaiscript::dispatch::detail::make_callable_impl<void(*)(int),false,false,false,false,void,int>
            (&local_478);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"help","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_498);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_478,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_438._M_dataplus._M_p = (pointer)throws_exception_abi_cxx11_;
  chaiscript::dispatch::detail::
  make_callable_impl<std::__cxx11::string(*)(std::function<void()>const&),false,false,false,false,std::__cxx11::string,std::function<void()>const&>
            (&local_478);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"throws_exception","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_498);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_478,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_438._M_dataplus._M_p = (pointer)get_eval_error;
  chaiscript::dispatch::detail::
  make_callable_impl<chaiscript::exception::eval_error(*)(std::function<void()>const&),false,false,false,false,chaiscript::exception::eval_error,std::function<void()>const&>
            (&local_478);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"get_eval_error","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_498);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_478,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_438._M_dataplus._M_p = (pointer)now;
  chaiscript::dispatch::detail::make_callable_impl<double(*)(),false,false,false,false,double>
            (&local_478);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"now","");
  chaiscript::Name_Validator::validate_object_name<std::__cxx11::string>(&local_498);
  chaiscript::detail::Dispatch_Engine::add_function(this,(Proxy_Function *)&local_478,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (0 < argc) {
    local_440 = (pointer)0x0;
    local_468._28_4_ = 0;
    iVar4 = 0;
    local_418 = (pointer)0x0;
    local_468._32_4_ = 0;
    do {
      iVar11 = iVar4;
      if (iVar4 == 0) {
        iVar11 = 1;
      }
      if (argc == 1) {
        iVar11 = iVar4;
      }
      peVar12 = (element_type *)0x35750e;
      if (iVar11 != 0) {
        peVar12 = (&(local_408->
                    super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)[iVar11];
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,(char *)peVar12,(allocator<char> *)&local_478);
      iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_498,"-c");
      if ((iVar4 == 0) ||
         (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_498,"--command"), iVar4 == 0)) {
        sVar10 = local_498._M_string_length;
        iVar4 = iVar11 + 1;
        if (argc <= iVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"insufficient input following ",0x1d);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_498._M_dataplus._M_p,
                              local_498._M_string_length);
          local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT71(local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_478,1);
LAB_0029d992:
          bVar1 = true;
          local_440 = (pointer)0x1;
          goto LAB_0029db39;
        }
        peVar12 = (&(local_408->
                    super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)[iVar4];
        __len2 = strlen((char *)peVar12);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&local_498,0,sVar10,(char *)peVar12,__len2);
        iVar11 = iVar4;
LAB_0029daaf:
        local_438._M_dataplus._M_p = (pointer)0x0;
        local_438._M_string_length = 0;
        local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"__EVAL__","");
        chaiscript::ChaiScript_Basic::eval
                  ((ChaiScript_Basic *)(local_370 + 0x10),(string *)&local_350,
                   (Exception_Handler *)&local_498,&local_438);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._24_8_);
        }
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length;
        if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_468) {
          operator_delete(local_478.
                          super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          CONCAT71(local_468._1_7_,local_468[0]) + 1);
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._M_string_length
          ;
        }
LAB_0029db2d:
        if ((pointer)this_00._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        bVar1 = false;
      }
      else {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_498,"-");
        if ((iVar4 == 0) ||
           (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_498,"--stdin"), iVar4 == 0)) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_498,0,local_498._M_string_length,"",0);
          local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_468;
          local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_468[0] = 0;
          while( true ) {
            cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x80);
            piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&std::cin,(string *)&local_478,cVar3);
            if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_438,
                       local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,(undefined1 *)
                              ((long)&(local_478.
                                       super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                              (long)local_478.
                                    super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux(&local_438,local_438._M_string_length,0,1,'\n');
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_498,local_438._M_dataplus._M_p,local_438._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_dataplus._M_p != &local_438.field_2) {
              operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)local_468) {
            operator_delete(local_478.
                            super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,CONCAT71(local_468._1_7_,local_468[0]) + 1);
          }
          goto LAB_0029daaf;
        }
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_498,"-v");
        sVar10 = 0x10;
        if (iVar4 == 0) {
          pcVar5 = "print(version())";
LAB_0029da9d:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_498,0,local_498._M_string_length,pcVar5,sVar10);
          goto LAB_0029daaf;
        }
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_498,"--version");
        pcVar5 = "print(version())";
        if (iVar4 == 0) goto LAB_0029da9d;
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_498,"-h");
        sVar10 = 8;
        if (iVar4 == 0) {
          pcVar5 = "help(-1)";
          goto LAB_0029da9d;
        }
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_498,"--help");
        pcVar5 = "help(-1)";
        if (iVar4 == 0) goto LAB_0029da9d;
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_498,"-e");
        bVar1 = false;
        if ((iVar4 != 0) &&
           (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_498,"--evalerrorok"), iVar4 != 0)) {
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_498,"--exception");
          if (iVar4 == 0) {
            local_468._32_4_ = 1;
            goto LAB_0029db39;
          }
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_498,"--any-exception");
          if (iVar4 == 0) {
            local_418 = (pointer)CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
            goto LAB_0029db39;
          }
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_498,"-i");
          if ((iVar4 == 0) ||
             (iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_498,"--interactive"),
             _Var2._M_p = local_498._M_dataplus._M_p, iVar4 == 0)) {
            interactive(&local_350);
            uVar9 = __cxa_rethrow();
            __cxa_end_catch();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._M_dataplus._M_p != &local_498.field_2) {
              operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1
                             );
            }
            chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&local_350);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3f8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3d8);
            _Unwind_Resume(uVar9);
          }
          if ((local_498._M_string_length != 0) &&
             (pcVar6 = (pointer)memchr(local_498._M_dataplus._M_p,0x2d,local_498._M_string_length),
             pcVar6 == _Var2._M_p && pcVar6 != (pointer)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"unrecognised argument ",0x16);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_498._M_dataplus._M_p,
                                local_498._M_string_length);
            local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 CONCAT71(local_478.
                          super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                          _1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_478,1);
            goto LAB_0029d992;
          }
          local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          chaiscript::ChaiScript_Basic::eval_file
                    ((ChaiScript_Basic *)local_370,(string *)&local_350,
                     (Exception_Handler *)&local_498);
          this_00._M_pi =
               local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_370._8_8_);
            this_00._M_pi =
                 local_478.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_0029db2d;
        }
        local_468._28_4_ = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
      }
LAB_0029db39:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        iVar4 = (int)local_440;
        goto LAB_0029de73;
      }
      iVar4 = iVar11 + 1;
    } while (iVar4 < argc);
  }
  iVar4 = 0;
LAB_0029de73:
  chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&local_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
// Disable deprecation warning for getenv call.
#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4996)
#endif

  const char *usepath = getenv("CHAI_USE_PATH");
  const char *modulepath = getenv("CHAI_MODULE_PATH");

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

  std::vector<std::string> usepaths;
  usepaths.emplace_back("");
  if (usepath != nullptr) {
    usepaths.emplace_back(usepath);
  }

  std::vector<std::string> modulepaths;
  std::vector<std::string> searchpaths = default_search_paths();
  modulepaths.insert(modulepaths.end(), searchpaths.begin(), searchpaths.end());
  modulepaths.emplace_back("");
  if (modulepath != nullptr) {
    modulepaths.emplace_back(modulepath);
  }

  chaiscript::ChaiScript_Basic chai(create_chaiscript_stdlib(), create_chaiscript_parser(), modulepaths, usepaths);

  chai.add(chaiscript::fun(&myexit), "exit");
  chai.add(chaiscript::fun(&myexit), "quit");
  chai.add(chaiscript::fun(&help), "help");
  chai.add(chaiscript::fun(&throws_exception), "throws_exception");
  chai.add(chaiscript::fun(&get_eval_error), "get_eval_error");
  chai.add(chaiscript::fun(&now), "now");

  bool eval_error_ok = false;
  bool boxed_exception_ok = false;
  bool any_exception_ok = false;

  for (int i = 0; i < argc; ++i) {
    if (i == 0 && argc > 1) {
      ++i;
    }

    std::string arg(i != 0 ? argv[i] : "--interactive");

    enum {
      eInteractive,
      eCommand,
      eFile
    } mode
        = eCommand;

    if (arg == "-c" || arg == "--command") {
      if ((i + 1) >= argc) {
        std::cout << "insufficient input following " << arg << '\n';
        return EXIT_FAILURE;
      }
      arg = argv[++i];

    } else if (arg == "-" || arg == "--stdin") {
      arg = "";
      std::string line;
      while (std::getline(std::cin, line)) {
        arg += line + '\n';
      }
    } else if (arg == "-v" || arg == "--version") {
      arg = "print(version())";
    } else if (arg == "-h" || arg == "--help") {
      arg = "help(-1)";
    } else if (arg == "-e" || arg == "--evalerrorok") {
      eval_error_ok = true;
      continue;
    } else if (arg == "--exception") {
      boxed_exception_ok = true;
      continue;
    } else if (arg == "--any-exception") {
      any_exception_ok = true;
      continue;
    } else if (arg == "-i" || arg == "--interactive") {
      mode = eInteractive;
    } else if (arg.find('-') == 0) {
      std::cout << "unrecognised argument " << arg << '\n';
      return EXIT_FAILURE;
    } else {
      mode = eFile;
    }

    try {
      switch (mode) {
        case eInteractive:
          interactive(chai);
          break;
        case eCommand:
          chai.eval(arg);
          break;
        case eFile:
          chai.eval_file(arg);
      }
    } catch (const chaiscript::exception::eval_error &ee) {
      std::cout << ee.pretty_print();
      std::cout << '\n';

      if (!eval_error_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::Boxed_Value &e) {
      std::cout << "Unhandled exception thrown of type " << e.get_type_info().name() << '\n';

      if (!boxed_exception_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::exception::load_module_error &e) {
      std::cout << "Unhandled module load error\n"
                << e.what() << '\n';
    } catch (std::exception &e) {
      std::cout << "Unhandled standard exception: " << e.what() << '\n';
      if (!any_exception_ok) {
        throw;
      }
    } catch (...) {
      std::cout << "Unhandled unknown exception" << '\n';
      if (!any_exception_ok) {
        throw;
      }
    }
  }

  return EXIT_SUCCESS;
}